

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_SetStringLarge_Test::TestBody
          (MicroStringPrevTest_SetStringLarge_Test *this)

{
  MicroString *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  ParamType *pPVar3;
  size_t sVar4;
  Arena *arena;
  char *pcVar5;
  string_view sVar6;
  AssertionResult gtest_ar;
  string input;
  char *copy_data;
  string copy;
  AssertHelper local_98;
  internal local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string_view local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string local_48;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_70,-0x80);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_48._M_dataplus._M_p;
  sVar2 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  pPVar3 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  this_00 = &(this->super_MicroStringPrevTest).str_;
  arena = (Arena *)0x0;
  if ((pPVar3->
      super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
      ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
    arena = &(this->super_MicroStringPrevTest).arena_;
  }
  MicroString::SetString(this_00,&local_48,arena,7);
  local_80 = MicroString::Get(this_00);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (local_90,"str_.Get()","input",&local_80,&local_70);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x249,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_80._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_80._M_len + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  sVar6 = MicroString::Get(this_00);
  local_80._M_len = (size_t)sVar6._M_str;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            (local_90,"copy_data","str_.Get().data()",(char **)&local_50,(char **)&local_80);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x24c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_80._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_80._M_len + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  pPVar3 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  if ((pPVar3->
      super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
      ).super__Tuple_impl<1UL,_google::protobuf::internal::(anonymous_namespace)::PreviousState>.
      super__Head_base<1UL,_google::protobuf::internal::(anonymous_namespace)::PreviousState,_false>
      ._M_head_impl != kString) {
    pPVar3 = testing::
             WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
             ::GetParam();
    if ((pPVar3->
        super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
        ).super__Head_base<0UL,_bool,_false>._M_head_impl == true) {
      local_80._M_len = 0x30;
      sVar4 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
      local_98.data_ = (AssertHelperData *)(sVar4 - sVar2);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_90,"ArenaAlignDefault::Ceil(kLargeRepSize + sizeof(std::string))",
                 "arena_space_used() - used",&local_80._M_len,(unsigned_long *)&local_98);
      if (local_90[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar5 = (local_88->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x253,pcVar5);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if ((long *)local_80._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_80._M_len + 8))();
        }
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
    }
  }
  local_80._M_len = 0x40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    local_80._M_len = local_70.field_2._M_allocated_capacity + 0x31;
  }
  local_98.data_ = (AssertHelperData *)MicroString::SpaceUsedExcludingSelfLong(this_00);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_90,"kLargeRepSize + sizeof(std::string) + input.capacity() + 1",
             "str_.SpaceUsedExcludingSelfLong()",&local_80._M_len,(unsigned_long *)&local_98);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar5 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x256,pcVar5);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_80._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_80._M_len + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetStringLarge) {
  std::string input(128, 'a');
  std::string copy = input;
  const char* copy_data = copy.data();
  const size_t used = arena_space_used();
  str_.Set(std::move(copy), arena());
  EXPECT_EQ(str_.Get(), input);

  // Verify that the string was moved.
  EXPECT_EQ(copy_data, str_.Get().data());

  // In 32-bit mode, we will use memory that is not rounded to the arena
  // alignment because sizeof(StringRep) might not be a multiple of 8. Avoid
  // using `ExpectMemoryUsed` because it expects it.
  if (prev_state() != kString && has_arena()) {
    EXPECT_EQ(ArenaAlignDefault::Ceil(kLargeRepSize + sizeof(std::string)),
              arena_space_used() - used);
  }
  EXPECT_EQ(kLargeRepSize + sizeof(std::string) + input.capacity() + /* \0 */ 1,
            str_.SpaceUsedExcludingSelfLong());
}